

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeleteView.h
# Opt level: O3

void __thiscall DeleteView<BaseUser>::display(DeleteView<BaseUser> *this)

{
  int iVar1;
  BaseUser *pBVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  long lVar5;
  char *pcVar6;
  
  if (Model<BaseUser>::objectList._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
      (_Base_ptr)0x0) {
    iVar1 = (this->super_View).context.requestObjectId;
    p_Var3 = &Model<BaseUser>::objectList._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var4 = Model<BaseUser>::objectList._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if (iVar1 <= (int)p_Var4[1]._M_color) {
        p_Var3 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < iVar1];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 !=
         &Model<BaseUser>::objectList._M_t._M_impl.super__Rb_tree_header) &&
       ((int)p_Var3[1]._M_color <= iVar1)) {
      (this->super_SingleObjectMixin<BaseUser>).object = (BaseUser *)&p_Var3[1]._M_parent;
    }
  }
  pBVar2 = (this->super_SingleObjectMixin<BaseUser>).object;
  if (pBVar2 == (BaseUser *)0x0) {
    pcVar6 = "Not found.\n";
    lVar5 = 0xb;
  }
  else {
    (*(pBVar2->super_Model<BaseUser>)._vptr_Model[1])();
    pcVar6 = "Successfully deleted.\n";
    lVar5 = 0x16;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar5);
  return;
}

Assistant:

void DeleteView<T>::display() {
    T *object = SingleObjectMixin<T>::getObject(context.requestObjectId);
    if (object) {
        object->remove();
        cout << "Successfully deleted.\n";
    } else cout << "Not found.\n";
}